

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O1

JDIMENSION get_24bit_row(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  J_COLOR_SPACE JVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  char cVar4;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  cjpeg_source_ptr pcVar13;
  size_t sVar14;
  long lVar15;
  JDIMENSION JVar16;
  code *pcVar17;
  _func_void_j_compress_ptr_cjpeg_source_ptr *__src;
  JSAMPROW __dest;
  ulong uVar18;
  int iVar19;
  double dVar20;
  int iVar21;
  short sVar22;
  int iVar23;
  double dVar26;
  int iVar29;
  undefined1 auVar27 [16];
  double dVar30;
  undefined1 auVar28 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  char cVar5;
  char cVar6;
  char cVar7;
  undefined4 uVar24;
  undefined6 uVar25;
  
  if (sinfo[1].buffer_height == 0) {
    pcVar13 = sinfo + 2;
    sVar14 = fread(sinfo[2].start_input,1,(ulong)*(uint *)((long)&sinfo[1].input_file + 4),
                   (FILE *)sinfo->input_file);
    if (sVar14 != *(uint *)((long)&sinfo[1].input_file + 4)) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x2b;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
  }
  else {
    JVar16 = *(int *)&sinfo[1].input_file - 1;
    *(JDIMENSION *)&sinfo[1].input_file = JVar16;
    pcVar13 = (cjpeg_source_ptr)
              (*cinfo->mem->access_virt_sarray)
                        ((j_common_ptr)cinfo,(jvirt_sarray_ptr)sinfo[1].finish_input,JVar16,1,0);
  }
  auVar12 = _DAT_0013a270;
  __src = pcVar13->start_input;
  __dest = *sinfo->buffer;
  JVar1 = cinfo->in_color_space;
  uVar18 = (ulong)JVar1;
  if (uVar18 == 4) {
    JVar16 = cinfo->image_width;
    if (JVar16 != 0) {
      pcVar17 = __src + 2;
      lVar15 = 0;
      do {
        auVar27._0_8_ = (double)(*(ushort *)(pcVar17 + -2) & 0xff);
        auVar27._8_8_ = (double)(byte)(*(ushort *)(pcVar17 + -2) >> 8);
        dVar20 = (double)(byte)*pcVar17 / -255.0 + 1.0;
        auVar27 = divpd(auVar27,auVar12);
        dVar26 = auVar27._0_8_ + 1.0;
        dVar30 = auVar27._8_8_ + 1.0;
        dVar31 = dVar20;
        if (dVar30 <= dVar20) {
          dVar31 = dVar30;
        }
        if (dVar26 <= dVar31) {
          dVar31 = dVar26;
        }
        dVar32 = 0.0;
        dVar33 = 0.0;
        dVar34 = 0.0;
        if ((dVar31 != 1.0) || (NAN(dVar31))) {
          dVar33 = 1.0 - dVar31;
          dVar32 = (dVar20 - dVar31) / dVar33;
          auVar28._0_8_ = dVar26 - dVar31;
          auVar28._8_8_ = dVar30 - dVar31;
          auVar11._8_8_ = dVar33;
          auVar11._0_8_ = dVar33;
          auVar27 = divpd(auVar28,auVar11);
          dVar33 = auVar27._0_8_;
          dVar34 = auVar27._8_8_;
        }
        iVar19 = (int)((255.0 - dVar33 * 255.0) + 0.5);
        iVar21 = (int)((255.0 - dVar31 * 255.0) + 0.5);
        iVar23 = (int)((255.0 - dVar32 * 255.0) + 0.5);
        iVar29 = (int)((255.0 - dVar34 * 255.0) + 0.5);
        sVar8 = (short)iVar23;
        cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar23 - (0xff < sVar8);
        sVar8 = (short)((uint)iVar23 >> 0x10);
        sVar22 = CONCAT11((0 < sVar8) * (sVar8 < 0x100) * (char)((uint)iVar23 >> 0x10) -
                          (0xff < sVar8),cVar4);
        sVar8 = (short)iVar29;
        cVar5 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar29 - (0xff < sVar8);
        sVar8 = (short)((uint)iVar29 >> 0x10);
        uVar24 = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * (char)((uint)iVar29 >> 0x10) -
                          (0xff < sVar8),CONCAT12(cVar5,sVar22));
        sVar8 = (short)iVar19;
        cVar6 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar19 - (0xff < sVar8);
        sVar8 = (short)((uint)iVar19 >> 0x10);
        uVar25 = CONCAT15((0 < sVar8) * (sVar8 < 0x100) * (char)((uint)iVar19 >> 0x10) -
                          (0xff < sVar8),CONCAT14(cVar6,uVar24));
        sVar8 = (short)iVar21;
        cVar7 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar21 - (0xff < sVar8);
        sVar10 = (short)((uint)iVar21 >> 0x10);
        sVar8 = (short)((uint)uVar24 >> 0x10);
        sVar9 = (short)((uint6)uVar25 >> 0x20);
        sVar10 = (short)(CONCAT17((0 < sVar10) * (sVar10 < 0x100) * (char)((uint)iVar21 >> 0x10) -
                                  (0xff < sVar10),CONCAT16(cVar7,uVar25)) >> 0x30);
        *(uint *)(__dest + lVar15 * 4) =
             CONCAT13((0 < sVar10) * (sVar10 < 0x100) * cVar7 - (0xff < sVar10),
                      CONCAT12((0 < sVar9) * (sVar9 < 0x100) * cVar6 - (0xff < sVar9),
                               CONCAT11((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                                        (0 < sVar22) * (sVar22 < 0x100) * cVar4 - (0xff < sVar22))))
        ;
        pcVar17 = pcVar17 + 3;
        lVar15 = lVar15 + 1;
      } while (JVar16 != (JDIMENSION)lVar15);
    }
  }
  else if (JVar1 == JCS_EXT_BGR) {
    memcpy(__dest,__src,(ulong)*(uint *)((long)&sinfo[1].input_file + 4));
  }
  else {
    iVar19 = rgb_red[uVar18];
    iVar21 = rgb_green[uVar18];
    iVar23 = rgb_blue[uVar18];
    iVar29 = rgb_pixelsize[uVar18];
    JVar16 = cinfo->image_width;
    if ((JVar1 & ~JCS_YCbCr) == JCS_EXT_RGBA) {
      if (JVar16 != 0) {
        uVar2 = alpha_index[uVar18];
        do {
          __dest[iVar23] = (JSAMPLE)*__src;
          __dest[iVar21] = (JSAMPLE)__src[1];
          __dest[iVar19] = (JSAMPLE)__src[2];
          __dest[uVar2] = 0xff;
          __dest = __dest + iVar29;
          __src = __src + 3;
          JVar16 = JVar16 - 1;
        } while (JVar16 != 0);
      }
    }
    else {
      for (; JVar16 != 0; JVar16 = JVar16 - 1) {
        __dest[iVar23] = (JSAMPLE)*__src;
        __dest[iVar21] = (JSAMPLE)__src[1];
        __dest[iVar19] = (JSAMPLE)__src[2];
        __dest = __dest + iVar29;
        __src = __src + 3;
      }
    }
  }
  return 1;
}

Assistant:

METHODDEF(JDIMENSION)
get_24bit_row(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
/* This version is for reading 24-bit pixels */
{
  tga_source_ptr source = (tga_source_ptr)sinfo;
  register JSAMPROW ptr;
  register JDIMENSION col;

  ptr = source->pub.buffer[0];
  for (col = cinfo->image_width; col > 0; col--) {
    (*source->read_pixel) (source); /* Load next pixel into tga_pixel */
    *ptr++ = (JSAMPLE)UCH(source->tga_pixel[2]); /* change BGR to RGB order */
    *ptr++ = (JSAMPLE)UCH(source->tga_pixel[1]);
    *ptr++ = (JSAMPLE)UCH(source->tga_pixel[0]);
  }
  return 1;
}